

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

int Pdr_SetContainsSimple(Pdr_Set_t *pOld,Pdr_Set_t *pNew)

{
  int *local_30;
  int *pNewInt;
  int *pOldInt;
  Pdr_Set_t *pNew_local;
  Pdr_Set_t *pOld_local;
  
  if (pOld->nLits < 1) {
    __assert_fail("pOld->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                  ,0x130,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
  }
  if (pNew->nLits < 1) {
    __assert_fail("pNew->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                  ,0x131,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
  }
  pNewInt = &pOld->nLits + pOld->nLits;
  local_30 = &pNew->nLits + pNew->nLits;
  while( true ) {
    while( true ) {
      if (local_30 < &pNew->field_0x14) {
        return 1;
      }
      if (*pNewInt == -1) {
        __assert_fail("*pOldInt != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                      ,0x136,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
      }
      if (*local_30 != -1) break;
      local_30 = local_30 + -1;
    }
    if (pNewInt < &pOld->field_0x14) {
      return 0;
    }
    if (*local_30 == -1) break;
    if (*pNewInt == -1) {
      __assert_fail("*pOldInt != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                    ,0x13f,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
    }
    if (*local_30 == *pNewInt) {
      local_30 = local_30 + -1;
    }
    else if (*pNewInt <= *local_30) {
      return 0;
    }
    pNewInt = pNewInt + -1;
  }
  __assert_fail("*pNewInt != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                ,0x13e,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
}

Assistant:

int Pdr_SetContainsSimple( Pdr_Set_t * pOld, Pdr_Set_t * pNew )
{
    int * pOldInt, * pNewInt;
    assert( pOld->nLits > 0 );
    assert( pNew->nLits > 0 );
    pOldInt = pOld->Lits + pOld->nLits - 1;
    pNewInt = pNew->Lits + pNew->nLits - 1;
    while ( pNew->Lits <= pNewInt )
    {
        assert( *pOldInt != -1 );
        if ( *pNewInt == -1 )
        {
            pNewInt--;
            continue;
        }
        if ( pOld->Lits > pOldInt )
            return 0;
        assert( *pNewInt != -1 );
        assert( *pOldInt != -1 );
        if ( *pNewInt == *pOldInt )
            pNewInt--, pOldInt--;
        else if ( *pNewInt < *pOldInt )
            pOldInt--;
        else
            return 0;
    }
    return 1;
}